

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZConsWriter.cpp
# Opt level: O2

void __thiscall
OpenMD::ZConsWriter::writeFZ
          (ZConsWriter *this,
          list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *fixedZmols)

{
  ostream *poVar1;
  _List_node_base *p_Var2;
  RealType RVar3;
  
  RVar3 = Snapshot::getTime(this->info_->sman_->currentSnapshot_);
  poVar1 = std::ostream::_M_insert<double>(RVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&this->output_);
  p_Var2 = (_List_node_base *)fixedZmols;
  while( true ) {
    std::endl<char,std::char_traits<char>>(poVar1);
    p_Var2 = (((_List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
              &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)fixedZmols) break;
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&this->output_,*(int *)((long)p_Var2[1]._M_next + 8));
    std::operator<<(poVar1,"\t");
    poVar1 = std::ostream::_M_insert<double>((double)p_Var2[3]._M_next);
    std::operator<<(poVar1,"\t");
    poVar1 = std::ostream::_M_insert<double>((double)p_Var2[3]._M_prev);
    std::operator<<(poVar1,"\t");
    poVar1 = std::ostream::_M_insert<double>((double)p_Var2[1]._M_prev);
  }
  return;
}

Assistant:

void ZConsWriter::writeFZ(const std::list<ZconstraintMol>& fixedZmols) {
#ifndef IS_MPI
    output_ << info_->getSnapshotManager()->getCurrentSnapshot()->getTime()
            << std::endl;
    output_ << fixedZmols.size() << std::endl;

    std::list<ZconstraintMol>::const_iterator i;
    for (i = fixedZmols.begin(); i != fixedZmols.end(); ++i) {
      output_ << i->mol->getGlobalIndex() << "\t" << i->fz << "\t" << i->zpos
              << "\t" << i->param.zTargetPos << std::endl;
    }
#else

    const int primaryNode = 0;
    int nproc;
    int myNode;
    MPI_Comm_size(MPI_COMM_WORLD, &nproc);
    MPI_Comm_rank(MPI_COMM_WORLD, &myNode);

    std::vector<int> tmpNFixedZmols(nproc, 0);
    std::vector<int> nFixedZmolsInProc(nproc, 0);
    tmpNFixedZmols[myNode] = fixedZmols.size();

    // do MPI_ALLREDUCE to exchange the total number of atoms,
    // rigidbodies and cutoff groups
    MPI_Allreduce(&tmpNFixedZmols[0], &nFixedZmolsInProc[0], nproc, MPI_INT,
                  MPI_SUM, MPI_COMM_WORLD);

    MPI_Status ierr;
    int zmolIndex;
    RealType data[3];

    if (myNode == primaryNode) {
      std::vector<ZconsData> zconsData;
      ZconsData tmpData;
      for (int i = 0; i < nproc; ++i) {
        if (i == primaryNode) {
          std::list<ZconstraintMol>::const_iterator j;
          for (j = fixedZmols.begin(); j != fixedZmols.end(); ++j) {
            tmpData.zmolIndex = j->mol->getGlobalIndex();
            tmpData.zforce    = j->fz;
            tmpData.zpos      = j->zpos;
            tmpData.zconsPos  = j->param.zTargetPos;
            zconsData.push_back(tmpData);
          }

        } else {
          for (int k = 0; k < nFixedZmolsInProc[i]; ++k) {
            MPI_Recv(&zmolIndex, 1, MPI_INT, i, 0, MPI_COMM_WORLD, &ierr);
            MPI_Recv(data, 3, MPI_REALTYPE, i, 0, MPI_COMM_WORLD, &ierr);
            tmpData.zmolIndex = zmolIndex;
            tmpData.zforce    = data[0];
            tmpData.zpos      = data[1];
            tmpData.zconsPos  = data[2];
            zconsData.push_back(tmpData);
          }
        }
      }

      output_ << info_->getSnapshotManager()->getCurrentSnapshot()->getTime()
              << std::endl;
      output_ << zconsData.size() << std::endl;

      std::vector<ZconsData>::iterator l;
      for (l = zconsData.begin(); l != zconsData.end(); ++l) {
        output_ << l->zmolIndex << "\t" << l->zforce << "\t" << l->zpos << "\t"
                << l->zconsPos << std::endl;
      }

    } else {
      std::list<ZconstraintMol>::const_iterator j;
      for (j = fixedZmols.begin(); j != fixedZmols.end(); ++j) {
        zmolIndex = j->mol->getGlobalIndex();
        data[0]   = j->fz;
        data[1]   = j->zpos;
        data[2]   = j->param.zTargetPos;
        MPI_Send(&zmolIndex, 1, MPI_INT, primaryNode, 0, MPI_COMM_WORLD);
        MPI_Send(data, 3, MPI_REALTYPE, primaryNode, 0, MPI_COMM_WORLD);
      }
    }
#endif
  }